

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O2

int lj_cf_table_foreachi(lua_State *L)

{
  TValue *pTVar1;
  MSize MVar2;
  GCtab *t;
  GCfunc *pGVar3;
  cTValue *pcVar4;
  uint key;
  
  t = lj_lib_checktab(L,1);
  pGVar3 = lj_lib_checkfunc(L,2);
  MVar2 = lj_tab_len(t);
  key = 1;
  while( true ) {
    if (MVar2 < key) {
      return 0;
    }
    pTVar1 = L->top;
    (pTVar1->u32).lo = (uint32_t)pGVar3;
    (pTVar1->field_2).it = 0xfffffff7;
    L->top[1].n = (double)(int)key;
    if (key < t->asize) {
      pcVar4 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)key * 8);
    }
    else {
      pcVar4 = lj_tab_getinth(t,key);
    }
    if (pcVar4 == (cTValue *)0x0) {
      *(undefined4 *)((long)L->top + 0x14) = 0xffffffff;
    }
    else {
      L->top[2] = *pcVar4;
    }
    L->top = L->top + 3;
    lua_call(L,2,1);
    if (*(int *)((long)L->top + -4) != -1) break;
    L->top = L->top + -1;
    key = key + 1;
  }
  return 1;
}

Assistant:

LJLIB_CF(table_foreachi)
{
  GCtab *t = lj_lib_checktab(L, 1);
  GCfunc *func = lj_lib_checkfunc(L, 2);
  MSize i, n = lj_tab_len(t);
  for (i = 1; i <= n; i++) {
    cTValue *val;
    setfuncV(L, L->top, func);
    setintV(L->top+1, i);
    val = lj_tab_getint(t, (int32_t)i);
    if (val) { copyTV(L, L->top+2, val); } else { setnilV(L->top+2); }
    L->top += 3;
    lua_call(L, 2, 1);
    if (!tvisnil(L->top-1))
      return 1;
    L->top--;
  }
  return 0;
}